

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O3

ui_entry_iterator *
initialize_ui_entry_iterator(ui_entry_predicate predicate,void *closure,char *sortcategory)

{
  wchar_t wVar1;
  _Bool _Var2;
  ui_entry_iterator *puVar3;
  ui_entry **ppuVar4;
  size_t nmemb;
  long lVar5;
  
  puVar3 = (ui_entry_iterator *)mem_alloc(0x10);
  ppuVar4 = (ui_entry **)mem_alloc((long)n_entry << 3);
  puVar3->entries = ppuVar4;
  puVar3->n = L'\0';
  puVar3->i = L'\0';
  if (n_entry < L'\x01') {
    nmemb = 0;
  }
  else {
    lVar5 = 0;
    ppuVar4 = entries;
    do {
      if ((ppuVar4[lVar5]->flags & L'\x00100000') == L'\0') {
        _Var2 = (*predicate)(ppuVar4[lVar5],closure);
        ppuVar4 = entries;
        if (_Var2) {
          wVar1 = puVar3->n;
          puVar3->entries[wVar1] = entries[lVar5];
          puVar3->n = wVar1 + L'\x01';
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < n_entry);
    ppuVar4 = puVar3->entries;
    nmemb = (size_t)puVar3->n;
  }
  category_for_cmp_desc_prio = sortcategory;
  sort(ppuVar4,nmemb,8,cmp_desc_prio);
  return puVar3;
}

Assistant:

struct ui_entry_iterator *initialize_ui_entry_iterator(
	ui_entry_predicate predicate, void *closure, const char *sortcategory)
{
	struct ui_entry_iterator *result = mem_alloc(sizeof(*result));
	int i;

	result->entries = mem_alloc(n_entry * sizeof(*result->entries));
	result->n = 0;
	result->i = 0;
	for (i = 0; i < n_entry; ++i) {
		if (! (entries[i]->flags & ENTRY_FLAG_TEMPLATE_ONLY) &&
			(*predicate)(entries[i], closure)) {
			result->entries[result->n] = entries[i];
			++result->n;
		}
	}
	category_for_cmp_desc_prio = sortcategory;
	sort(result->entries, result->n, sizeof(*result->entries),
		cmp_desc_prio);
	return result;
}